

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

void __thiscall leveldb::Harness::Add(Harness *this,string *key,string *value)

{
  Slice local_10;
  
  local_10.data_ = (value->_M_dataplus)._M_p;
  local_10.size_ = value->_M_string_length;
  Constructor::Add(this->constructor_,key,&local_10);
  return;
}

Assistant:

void Add(const std::string& key, const std::string& value) {
    constructor_->Add(key, value);
  }